

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O2

int32_t stringIteratorMove(UCharIterator *iter,int32_t delta,UCharIteratorOrigin origin)

{
  int iVar1;
  
  switch(origin) {
  case UITER_START:
    delta = delta + iter->start;
    break;
  case UITER_CURRENT:
    delta = delta + iter->index;
    break;
  case UITER_LIMIT:
    delta = delta + iter->limit;
    break;
  case UITER_ZERO:
    break;
  case UITER_LENGTH:
    delta = delta + iter->length;
    break;
  default:
    return -1;
  }
  iVar1 = iter->start;
  if ((iter->start <= delta) && (iVar1 = iter->limit, delta < iter->limit)) {
    iVar1 = delta;
  }
  iter->index = iVar1;
  return iVar1;
}

Assistant:

static int32_t U_CALLCONV
stringIteratorMove(UCharIterator *iter, int32_t delta, UCharIteratorOrigin origin) {
    int32_t pos;

    switch(origin) {
    case UITER_ZERO:
        pos=delta;
        break;
    case UITER_START:
        pos=iter->start+delta;
        break;
    case UITER_CURRENT:
        pos=iter->index+delta;
        break;
    case UITER_LIMIT:
        pos=iter->limit+delta;
        break;
    case UITER_LENGTH:
        pos=iter->length+delta;
        break;
    default:
        return -1;  /* Error */
    }

    if(pos<iter->start) {
        pos=iter->start;
    } else if(pos>iter->limit) {
        pos=iter->limit;
    }

    return iter->index=pos;
}